

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  FILE *__stream;
  FILE *__stream_00;
  long lVar3;
  char *pcVar4;
  int iVar5;
  
  bVar2 = 1 < argc;
  if (argc < 2) {
LAB_00102c50:
    puts(
        "Usage: predict [options] test_file model_file output_file\noptions:\n-b probability_estimates: whether to output probability estimates, 0 or 1 (default 0); currently for logistic regression only\n-q : quiet mode (no outputs)"
        );
    exit(1);
  }
  pcVar4 = argv[1];
  lVar3 = 1;
  if (*pcVar4 == '-') {
    iVar5 = 1;
    do {
      if (pcVar4[1] == 'q') {
        info = print_null;
      }
      else {
        if (pcVar4[1] != 'b') {
          main_cold_4();
          goto LAB_00102c6e;
        }
        lVar3 = (long)iVar5;
        iVar5 = iVar5 + 1;
        flag_predict_probability = atoi(argv[lVar3 + 1]);
      }
      iVar5 = iVar5 + 1;
      bVar2 = iVar5 < argc;
      if (argc <= iVar5) goto LAB_00102c50;
      lVar3 = (long)iVar5;
      pcVar4 = argv[lVar3];
    } while (*pcVar4 == '-');
  }
  if (!bVar2) goto LAB_00102c50;
  ppcVar1 = argv + lVar3;
  __stream = fopen(*ppcVar1,"r");
  if (__stream == (FILE *)0x0) {
LAB_00102c6e:
    main_cold_3();
  }
  else {
    __stream_00 = fopen(ppcVar1[2],"w");
    if (__stream_00 != (FILE *)0x0) {
      model_ = (model *)load_model(ppcVar1[1]);
      if (model_ != (model *)0x0) {
        x = (feature_node *)malloc((long)max_nr_attr << 4);
        do_predict((FILE *)__stream,(FILE *)__stream_00);
        free_and_destroy_model(&model_);
        free(line);
        free(x);
        fclose(__stream);
        fclose(__stream_00);
        return 0;
      }
      goto LAB_00102c82;
    }
  }
  main_cold_2();
LAB_00102c82:
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(int argc, char **argv)
{
	FILE *input, *output;
	int i;

	// parse options
	for(i=1;i<argc;i++)
	{
		if(argv[i][0] != '-') break;
		++i;
		switch(argv[i-1][1])
		{
			case 'b':
				flag_predict_probability = atoi(argv[i]);
				break;
			case 'q':
				info = &print_null;
				i--;
				break;
			default:
				fprintf(stderr,"unknown option: -%c\n", argv[i-1][1]);
				exit_with_help();
				break;
		}
	}
	if(i>=argc)
		exit_with_help();

	input = fopen(argv[i],"r");
	if(input == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",argv[i]);
		exit(1);
	}

	output = fopen(argv[i+2],"w");
	if(output == NULL)
	{
		fprintf(stderr,"can't open output file %s\n",argv[i+2]);
		exit(1);
	}

	if((model_=load_model(argv[i+1]))==0)
	{
		fprintf(stderr,"can't open model file %s\n",argv[i+1]);
		exit(1);
	}

	x = (struct feature_node *) malloc(max_nr_attr*sizeof(struct feature_node));
	do_predict(input, output);
	free_and_destroy_model(&model_);
	free(line);
	free(x);
	fclose(input);
	fclose(output);
	return 0;
}